

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_VERSION_4_5(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_VERSION_4_5 != 0) {
    glad_glClipControl = (PFNGLCLIPCONTROLPROC)(*load)("glClipControl");
    glad_glCreateTransformFeedbacks =
         (PFNGLCREATETRANSFORMFEEDBACKSPROC)(*load)("glCreateTransformFeedbacks");
    glad_glTransformFeedbackBufferBase =
         (PFNGLTRANSFORMFEEDBACKBUFFERBASEPROC)(*load)("glTransformFeedbackBufferBase");
    glad_glTransformFeedbackBufferRange =
         (PFNGLTRANSFORMFEEDBACKBUFFERRANGEPROC)(*load)("glTransformFeedbackBufferRange");
    glad_glGetTransformFeedbackiv =
         (PFNGLGETTRANSFORMFEEDBACKIVPROC)(*load)("glGetTransformFeedbackiv");
    glad_glGetTransformFeedbacki_v =
         (PFNGLGETTRANSFORMFEEDBACKI_VPROC)(*load)("glGetTransformFeedbacki_v");
    glad_glGetTransformFeedbacki64_v =
         (PFNGLGETTRANSFORMFEEDBACKI64_VPROC)(*load)("glGetTransformFeedbacki64_v");
    glad_glCreateBuffers = (PFNGLCREATEBUFFERSPROC)(*load)("glCreateBuffers");
    glad_glNamedBufferStorage = (PFNGLNAMEDBUFFERSTORAGEPROC)(*load)("glNamedBufferStorage");
    glad_glNamedBufferData = (PFNGLNAMEDBUFFERDATAPROC)(*load)("glNamedBufferData");
    glad_glNamedBufferSubData = (PFNGLNAMEDBUFFERSUBDATAPROC)(*load)("glNamedBufferSubData");
    glad_glCopyNamedBufferSubData =
         (PFNGLCOPYNAMEDBUFFERSUBDATAPROC)(*load)("glCopyNamedBufferSubData");
    glad_glClearNamedBufferData = (PFNGLCLEARNAMEDBUFFERDATAPROC)(*load)("glClearNamedBufferData");
    glad_glClearNamedBufferSubData =
         (PFNGLCLEARNAMEDBUFFERSUBDATAPROC)(*load)("glClearNamedBufferSubData");
    glad_glMapNamedBuffer = (PFNGLMAPNAMEDBUFFERPROC)(*load)("glMapNamedBuffer");
    glad_glMapNamedBufferRange = (PFNGLMAPNAMEDBUFFERRANGEPROC)(*load)("glMapNamedBufferRange");
    glad_glUnmapNamedBuffer = (PFNGLUNMAPNAMEDBUFFERPROC)(*load)("glUnmapNamedBuffer");
    glad_glFlushMappedNamedBufferRange =
         (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGEPROC)(*load)("glFlushMappedNamedBufferRange");
    glad_glGetNamedBufferParameteriv =
         (PFNGLGETNAMEDBUFFERPARAMETERIVPROC)(*load)("glGetNamedBufferParameteriv");
    glad_glGetNamedBufferParameteri64v =
         (PFNGLGETNAMEDBUFFERPARAMETERI64VPROC)(*load)("glGetNamedBufferParameteri64v");
    glad_glGetNamedBufferPointerv =
         (PFNGLGETNAMEDBUFFERPOINTERVPROC)(*load)("glGetNamedBufferPointerv");
    glad_glGetNamedBufferSubData =
         (PFNGLGETNAMEDBUFFERSUBDATAPROC)(*load)("glGetNamedBufferSubData");
    glad_glCreateFramebuffers = (PFNGLCREATEFRAMEBUFFERSPROC)(*load)("glCreateFramebuffers");
    glad_glNamedFramebufferRenderbuffer =
         (PFNGLNAMEDFRAMEBUFFERRENDERBUFFERPROC)(*load)("glNamedFramebufferRenderbuffer");
    glad_glNamedFramebufferParameteri =
         (PFNGLNAMEDFRAMEBUFFERPARAMETERIPROC)(*load)("glNamedFramebufferParameteri");
    glad_glNamedFramebufferTexture =
         (PFNGLNAMEDFRAMEBUFFERTEXTUREPROC)(*load)("glNamedFramebufferTexture");
    glad_glNamedFramebufferTextureLayer =
         (PFNGLNAMEDFRAMEBUFFERTEXTURELAYERPROC)(*load)("glNamedFramebufferTextureLayer");
    glad_glNamedFramebufferDrawBuffer =
         (PFNGLNAMEDFRAMEBUFFERDRAWBUFFERPROC)(*load)("glNamedFramebufferDrawBuffer");
    glad_glNamedFramebufferDrawBuffers =
         (PFNGLNAMEDFRAMEBUFFERDRAWBUFFERSPROC)(*load)("glNamedFramebufferDrawBuffers");
    glad_glNamedFramebufferReadBuffer =
         (PFNGLNAMEDFRAMEBUFFERREADBUFFERPROC)(*load)("glNamedFramebufferReadBuffer");
    glad_glInvalidateNamedFramebufferData =
         (PFNGLINVALIDATENAMEDFRAMEBUFFERDATAPROC)(*load)("glInvalidateNamedFramebufferData");
    glad_glInvalidateNamedFramebufferSubData =
         (PFNGLINVALIDATENAMEDFRAMEBUFFERSUBDATAPROC)(*load)("glInvalidateNamedFramebufferSubData");
    glad_glClearNamedFramebufferiv =
         (PFNGLCLEARNAMEDFRAMEBUFFERIVPROC)(*load)("glClearNamedFramebufferiv");
    glad_glClearNamedFramebufferuiv =
         (PFNGLCLEARNAMEDFRAMEBUFFERUIVPROC)(*load)("glClearNamedFramebufferuiv");
    glad_glClearNamedFramebufferfv =
         (PFNGLCLEARNAMEDFRAMEBUFFERFVPROC)(*load)("glClearNamedFramebufferfv");
    glad_glClearNamedFramebufferfi =
         (PFNGLCLEARNAMEDFRAMEBUFFERFIPROC)(*load)("glClearNamedFramebufferfi");
    glad_glBlitNamedFramebuffer = (PFNGLBLITNAMEDFRAMEBUFFERPROC)(*load)("glBlitNamedFramebuffer");
    glad_glCheckNamedFramebufferStatus =
         (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSPROC)(*load)("glCheckNamedFramebufferStatus");
    glad_glGetNamedFramebufferParameteriv =
         (PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC)(*load)("glGetNamedFramebufferParameteriv");
    glad_glGetNamedFramebufferAttachmentParameteriv =
         (PFNGLGETNAMEDFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
         (*load)("glGetNamedFramebufferAttachmentParameteriv");
    glad_glCreateRenderbuffers = (PFNGLCREATERENDERBUFFERSPROC)(*load)("glCreateRenderbuffers");
    glad_glNamedRenderbufferStorage =
         (PFNGLNAMEDRENDERBUFFERSTORAGEPROC)(*load)("glNamedRenderbufferStorage");
    glad_glNamedRenderbufferStorageMultisample =
         (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLEPROC)
         (*load)("glNamedRenderbufferStorageMultisample");
    glad_glGetNamedRenderbufferParameteriv =
         (PFNGLGETNAMEDRENDERBUFFERPARAMETERIVPROC)(*load)("glGetNamedRenderbufferParameteriv");
    glad_glCreateTextures = (PFNGLCREATETEXTURESPROC)(*load)("glCreateTextures");
    glad_glTextureBuffer = (PFNGLTEXTUREBUFFERPROC)(*load)("glTextureBuffer");
    glad_glTextureBufferRange = (PFNGLTEXTUREBUFFERRANGEPROC)(*load)("glTextureBufferRange");
    glad_glTextureStorage1D = (PFNGLTEXTURESTORAGE1DPROC)(*load)("glTextureStorage1D");
    glad_glTextureStorage2D = (PFNGLTEXTURESTORAGE2DPROC)(*load)("glTextureStorage2D");
    glad_glTextureStorage3D = (PFNGLTEXTURESTORAGE3DPROC)(*load)("glTextureStorage3D");
    glad_glTextureStorage2DMultisample =
         (PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC)(*load)("glTextureStorage2DMultisample");
    glad_glTextureStorage3DMultisample =
         (PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC)(*load)("glTextureStorage3DMultisample");
    glad_glTextureSubImage1D = (PFNGLTEXTURESUBIMAGE1DPROC)(*load)("glTextureSubImage1D");
    glad_glTextureSubImage2D = (PFNGLTEXTURESUBIMAGE2DPROC)(*load)("glTextureSubImage2D");
    glad_glTextureSubImage3D = (PFNGLTEXTURESUBIMAGE3DPROC)(*load)("glTextureSubImage3D");
    glad_glCompressedTextureSubImage1D =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE1DPROC)(*load)("glCompressedTextureSubImage1D");
    glad_glCompressedTextureSubImage2D =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE2DPROC)(*load)("glCompressedTextureSubImage2D");
    glad_glCompressedTextureSubImage3D =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE3DPROC)(*load)("glCompressedTextureSubImage3D");
    glad_glCopyTextureSubImage1D =
         (PFNGLCOPYTEXTURESUBIMAGE1DPROC)(*load)("glCopyTextureSubImage1D");
    glad_glCopyTextureSubImage2D =
         (PFNGLCOPYTEXTURESUBIMAGE2DPROC)(*load)("glCopyTextureSubImage2D");
    glad_glCopyTextureSubImage3D =
         (PFNGLCOPYTEXTURESUBIMAGE3DPROC)(*load)("glCopyTextureSubImage3D");
    glad_glTextureParameterf = (PFNGLTEXTUREPARAMETERFPROC)(*load)("glTextureParameterf");
    glad_glTextureParameterfv = (PFNGLTEXTUREPARAMETERFVPROC)(*load)("glTextureParameterfv");
    glad_glTextureParameteri = (PFNGLTEXTUREPARAMETERIPROC)(*load)("glTextureParameteri");
    glad_glTextureParameterIiv = (PFNGLTEXTUREPARAMETERIIVPROC)(*load)("glTextureParameterIiv");
    glad_glTextureParameterIuiv = (PFNGLTEXTUREPARAMETERIUIVPROC)(*load)("glTextureParameterIuiv");
    glad_glTextureParameteriv = (PFNGLTEXTUREPARAMETERIVPROC)(*load)("glTextureParameteriv");
    glad_glGenerateTextureMipmap =
         (PFNGLGENERATETEXTUREMIPMAPPROC)(*load)("glGenerateTextureMipmap");
    glad_glBindTextureUnit = (PFNGLBINDTEXTUREUNITPROC)(*load)("glBindTextureUnit");
    glad_glGetTextureImage = (PFNGLGETTEXTUREIMAGEPROC)(*load)("glGetTextureImage");
    glad_glGetCompressedTextureImage =
         (PFNGLGETCOMPRESSEDTEXTUREIMAGEPROC)(*load)("glGetCompressedTextureImage");
    glad_glGetTextureLevelParameterfv =
         (PFNGLGETTEXTURELEVELPARAMETERFVPROC)(*load)("glGetTextureLevelParameterfv");
    glad_glGetTextureLevelParameteriv =
         (PFNGLGETTEXTURELEVELPARAMETERIVPROC)(*load)("glGetTextureLevelParameteriv");
    glad_glGetTextureParameterfv =
         (PFNGLGETTEXTUREPARAMETERFVPROC)(*load)("glGetTextureParameterfv");
    glad_glGetTextureParameterIiv =
         (PFNGLGETTEXTUREPARAMETERIIVPROC)(*load)("glGetTextureParameterIiv");
    glad_glGetTextureParameterIuiv =
         (PFNGLGETTEXTUREPARAMETERIUIVPROC)(*load)("glGetTextureParameterIuiv");
    glad_glGetTextureParameteriv =
         (PFNGLGETTEXTUREPARAMETERIVPROC)(*load)("glGetTextureParameteriv");
    glad_glCreateVertexArrays = (PFNGLCREATEVERTEXARRAYSPROC)(*load)("glCreateVertexArrays");
    glad_glDisableVertexArrayAttrib =
         (PFNGLDISABLEVERTEXARRAYATTRIBPROC)(*load)("glDisableVertexArrayAttrib");
    glad_glEnableVertexArrayAttrib =
         (PFNGLENABLEVERTEXARRAYATTRIBPROC)(*load)("glEnableVertexArrayAttrib");
    glad_glVertexArrayElementBuffer =
         (PFNGLVERTEXARRAYELEMENTBUFFERPROC)(*load)("glVertexArrayElementBuffer");
    glad_glVertexArrayVertexBuffer =
         (PFNGLVERTEXARRAYVERTEXBUFFERPROC)(*load)("glVertexArrayVertexBuffer");
    glad_glVertexArrayVertexBuffers =
         (PFNGLVERTEXARRAYVERTEXBUFFERSPROC)(*load)("glVertexArrayVertexBuffers");
    glad_glVertexArrayAttribBinding =
         (PFNGLVERTEXARRAYATTRIBBINDINGPROC)(*load)("glVertexArrayAttribBinding");
    glad_glVertexArrayAttribFormat =
         (PFNGLVERTEXARRAYATTRIBFORMATPROC)(*load)("glVertexArrayAttribFormat");
    glad_glVertexArrayAttribIFormat =
         (PFNGLVERTEXARRAYATTRIBIFORMATPROC)(*load)("glVertexArrayAttribIFormat");
    glad_glVertexArrayAttribLFormat =
         (PFNGLVERTEXARRAYATTRIBLFORMATPROC)(*load)("glVertexArrayAttribLFormat");
    glad_glVertexArrayBindingDivisor =
         (PFNGLVERTEXARRAYBINDINGDIVISORPROC)(*load)("glVertexArrayBindingDivisor");
    glad_glGetVertexArrayiv = (PFNGLGETVERTEXARRAYIVPROC)(*load)("glGetVertexArrayiv");
    glad_glGetVertexArrayIndexediv =
         (PFNGLGETVERTEXARRAYINDEXEDIVPROC)(*load)("glGetVertexArrayIndexediv");
    glad_glGetVertexArrayIndexed64iv =
         (PFNGLGETVERTEXARRAYINDEXED64IVPROC)(*load)("glGetVertexArrayIndexed64iv");
    glad_glCreateSamplers = (PFNGLCREATESAMPLERSPROC)(*load)("glCreateSamplers");
    glad_glCreateProgramPipelines =
         (PFNGLCREATEPROGRAMPIPELINESPROC)(*load)("glCreateProgramPipelines");
    glad_glCreateQueries = (PFNGLCREATEQUERIESPROC)(*load)("glCreateQueries");
    glad_glGetQueryBufferObjecti64v =
         (PFNGLGETQUERYBUFFEROBJECTI64VPROC)(*load)("glGetQueryBufferObjecti64v");
    glad_glGetQueryBufferObjectiv =
         (PFNGLGETQUERYBUFFEROBJECTIVPROC)(*load)("glGetQueryBufferObjectiv");
    glad_glGetQueryBufferObjectui64v =
         (PFNGLGETQUERYBUFFEROBJECTUI64VPROC)(*load)("glGetQueryBufferObjectui64v");
    glad_glGetQueryBufferObjectuiv =
         (PFNGLGETQUERYBUFFEROBJECTUIVPROC)(*load)("glGetQueryBufferObjectuiv");
    glad_glMemoryBarrierByRegion =
         (PFNGLMEMORYBARRIERBYREGIONPROC)(*load)("glMemoryBarrierByRegion");
    glad_glGetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)(*load)("glGetTextureSubImage");
    glad_glGetCompressedTextureSubImage =
         (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)(*load)("glGetCompressedTextureSubImage");
    glad_glGetGraphicsResetStatus =
         (PFNGLGETGRAPHICSRESETSTATUSPROC)(*load)("glGetGraphicsResetStatus");
    glad_glGetnCompressedTexImage =
         (PFNGLGETNCOMPRESSEDTEXIMAGEPROC)(*load)("glGetnCompressedTexImage");
    glad_glGetnTexImage = (PFNGLGETNTEXIMAGEPROC)(*load)("glGetnTexImage");
    glad_glGetnUniformdv = (PFNGLGETNUNIFORMDVPROC)(*load)("glGetnUniformdv");
    glad_glGetnUniformfv = (PFNGLGETNUNIFORMFVPROC)(*load)("glGetnUniformfv");
    glad_glGetnUniformiv = (PFNGLGETNUNIFORMIVPROC)(*load)("glGetnUniformiv");
    glad_glGetnUniformuiv = (PFNGLGETNUNIFORMUIVPROC)(*load)("glGetnUniformuiv");
    glad_glReadnPixels = (PFNGLREADNPIXELSPROC)(*load)("glReadnPixels");
    glad_glGetnMapdv = (PFNGLGETNMAPDVPROC)(*load)("glGetnMapdv");
    glad_glGetnMapfv = (PFNGLGETNMAPFVPROC)(*load)("glGetnMapfv");
    glad_glGetnMapiv = (PFNGLGETNMAPIVPROC)(*load)("glGetnMapiv");
    glad_glGetnPixelMapfv = (PFNGLGETNPIXELMAPFVPROC)(*load)("glGetnPixelMapfv");
    glad_glGetnPixelMapuiv = (PFNGLGETNPIXELMAPUIVPROC)(*load)("glGetnPixelMapuiv");
    glad_glGetnPixelMapusv = (PFNGLGETNPIXELMAPUSVPROC)(*load)("glGetnPixelMapusv");
    glad_glGetnPolygonStipple = (PFNGLGETNPOLYGONSTIPPLEPROC)(*load)("glGetnPolygonStipple");
    glad_glGetnColorTable = (PFNGLGETNCOLORTABLEPROC)(*load)("glGetnColorTable");
    glad_glGetnConvolutionFilter =
         (PFNGLGETNCONVOLUTIONFILTERPROC)(*load)("glGetnConvolutionFilter");
    glad_glGetnSeparableFilter = (PFNGLGETNSEPARABLEFILTERPROC)(*load)("glGetnSeparableFilter");
    glad_glGetnHistogram = (PFNGLGETNHISTOGRAMPROC)(*load)("glGetnHistogram");
    glad_glGetnMinmax = (PFNGLGETNMINMAXPROC)(*load)("glGetnMinmax");
    glad_glTextureBarrier = (PFNGLTEXTUREBARRIERPROC)(*load)("glTextureBarrier");
  }
  return;
}

Assistant:

static void load_GL_VERSION_4_5(GLADloadproc load) {
	if(!GLAD_GL_VERSION_4_5) return;
	glad_glClipControl = (PFNGLCLIPCONTROLPROC)load("glClipControl");
	glad_glCreateTransformFeedbacks = (PFNGLCREATETRANSFORMFEEDBACKSPROC)load("glCreateTransformFeedbacks");
	glad_glTransformFeedbackBufferBase = (PFNGLTRANSFORMFEEDBACKBUFFERBASEPROC)load("glTransformFeedbackBufferBase");
	glad_glTransformFeedbackBufferRange = (PFNGLTRANSFORMFEEDBACKBUFFERRANGEPROC)load("glTransformFeedbackBufferRange");
	glad_glGetTransformFeedbackiv = (PFNGLGETTRANSFORMFEEDBACKIVPROC)load("glGetTransformFeedbackiv");
	glad_glGetTransformFeedbacki_v = (PFNGLGETTRANSFORMFEEDBACKI_VPROC)load("glGetTransformFeedbacki_v");
	glad_glGetTransformFeedbacki64_v = (PFNGLGETTRANSFORMFEEDBACKI64_VPROC)load("glGetTransformFeedbacki64_v");
	glad_glCreateBuffers = (PFNGLCREATEBUFFERSPROC)load("glCreateBuffers");
	glad_glNamedBufferStorage = (PFNGLNAMEDBUFFERSTORAGEPROC)load("glNamedBufferStorage");
	glad_glNamedBufferData = (PFNGLNAMEDBUFFERDATAPROC)load("glNamedBufferData");
	glad_glNamedBufferSubData = (PFNGLNAMEDBUFFERSUBDATAPROC)load("glNamedBufferSubData");
	glad_glCopyNamedBufferSubData = (PFNGLCOPYNAMEDBUFFERSUBDATAPROC)load("glCopyNamedBufferSubData");
	glad_glClearNamedBufferData = (PFNGLCLEARNAMEDBUFFERDATAPROC)load("glClearNamedBufferData");
	glad_glClearNamedBufferSubData = (PFNGLCLEARNAMEDBUFFERSUBDATAPROC)load("glClearNamedBufferSubData");
	glad_glMapNamedBuffer = (PFNGLMAPNAMEDBUFFERPROC)load("glMapNamedBuffer");
	glad_glMapNamedBufferRange = (PFNGLMAPNAMEDBUFFERRANGEPROC)load("glMapNamedBufferRange");
	glad_glUnmapNamedBuffer = (PFNGLUNMAPNAMEDBUFFERPROC)load("glUnmapNamedBuffer");
	glad_glFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGEPROC)load("glFlushMappedNamedBufferRange");
	glad_glGetNamedBufferParameteriv = (PFNGLGETNAMEDBUFFERPARAMETERIVPROC)load("glGetNamedBufferParameteriv");
	glad_glGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64VPROC)load("glGetNamedBufferParameteri64v");
	glad_glGetNamedBufferPointerv = (PFNGLGETNAMEDBUFFERPOINTERVPROC)load("glGetNamedBufferPointerv");
	glad_glGetNamedBufferSubData = (PFNGLGETNAMEDBUFFERSUBDATAPROC)load("glGetNamedBufferSubData");
	glad_glCreateFramebuffers = (PFNGLCREATEFRAMEBUFFERSPROC)load("glCreateFramebuffers");
	glad_glNamedFramebufferRenderbuffer = (PFNGLNAMEDFRAMEBUFFERRENDERBUFFERPROC)load("glNamedFramebufferRenderbuffer");
	glad_glNamedFramebufferParameteri = (PFNGLNAMEDFRAMEBUFFERPARAMETERIPROC)load("glNamedFramebufferParameteri");
	glad_glNamedFramebufferTexture = (PFNGLNAMEDFRAMEBUFFERTEXTUREPROC)load("glNamedFramebufferTexture");
	glad_glNamedFramebufferTextureLayer = (PFNGLNAMEDFRAMEBUFFERTEXTURELAYERPROC)load("glNamedFramebufferTextureLayer");
	glad_glNamedFramebufferDrawBuffer = (PFNGLNAMEDFRAMEBUFFERDRAWBUFFERPROC)load("glNamedFramebufferDrawBuffer");
	glad_glNamedFramebufferDrawBuffers = (PFNGLNAMEDFRAMEBUFFERDRAWBUFFERSPROC)load("glNamedFramebufferDrawBuffers");
	glad_glNamedFramebufferReadBuffer = (PFNGLNAMEDFRAMEBUFFERREADBUFFERPROC)load("glNamedFramebufferReadBuffer");
	glad_glInvalidateNamedFramebufferData = (PFNGLINVALIDATENAMEDFRAMEBUFFERDATAPROC)load("glInvalidateNamedFramebufferData");
	glad_glInvalidateNamedFramebufferSubData = (PFNGLINVALIDATENAMEDFRAMEBUFFERSUBDATAPROC)load("glInvalidateNamedFramebufferSubData");
	glad_glClearNamedFramebufferiv = (PFNGLCLEARNAMEDFRAMEBUFFERIVPROC)load("glClearNamedFramebufferiv");
	glad_glClearNamedFramebufferuiv = (PFNGLCLEARNAMEDFRAMEBUFFERUIVPROC)load("glClearNamedFramebufferuiv");
	glad_glClearNamedFramebufferfv = (PFNGLCLEARNAMEDFRAMEBUFFERFVPROC)load("glClearNamedFramebufferfv");
	glad_glClearNamedFramebufferfi = (PFNGLCLEARNAMEDFRAMEBUFFERFIPROC)load("glClearNamedFramebufferfi");
	glad_glBlitNamedFramebuffer = (PFNGLBLITNAMEDFRAMEBUFFERPROC)load("glBlitNamedFramebuffer");
	glad_glCheckNamedFramebufferStatus = (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSPROC)load("glCheckNamedFramebufferStatus");
	glad_glGetNamedFramebufferParameteriv = (PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC)load("glGetNamedFramebufferParameteriv");
	glad_glGetNamedFramebufferAttachmentParameteriv = (PFNGLGETNAMEDFRAMEBUFFERATTACHMENTPARAMETERIVPROC)load("glGetNamedFramebufferAttachmentParameteriv");
	glad_glCreateRenderbuffers = (PFNGLCREATERENDERBUFFERSPROC)load("glCreateRenderbuffers");
	glad_glNamedRenderbufferStorage = (PFNGLNAMEDRENDERBUFFERSTORAGEPROC)load("glNamedRenderbufferStorage");
	glad_glNamedRenderbufferStorageMultisample = (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLEPROC)load("glNamedRenderbufferStorageMultisample");
	glad_glGetNamedRenderbufferParameteriv = (PFNGLGETNAMEDRENDERBUFFERPARAMETERIVPROC)load("glGetNamedRenderbufferParameteriv");
	glad_glCreateTextures = (PFNGLCREATETEXTURESPROC)load("glCreateTextures");
	glad_glTextureBuffer = (PFNGLTEXTUREBUFFERPROC)load("glTextureBuffer");
	glad_glTextureBufferRange = (PFNGLTEXTUREBUFFERRANGEPROC)load("glTextureBufferRange");
	glad_glTextureStorage1D = (PFNGLTEXTURESTORAGE1DPROC)load("glTextureStorage1D");
	glad_glTextureStorage2D = (PFNGLTEXTURESTORAGE2DPROC)load("glTextureStorage2D");
	glad_glTextureStorage3D = (PFNGLTEXTURESTORAGE3DPROC)load("glTextureStorage3D");
	glad_glTextureStorage2DMultisample = (PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC)load("glTextureStorage2DMultisample");
	glad_glTextureStorage3DMultisample = (PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC)load("glTextureStorage3DMultisample");
	glad_glTextureSubImage1D = (PFNGLTEXTURESUBIMAGE1DPROC)load("glTextureSubImage1D");
	glad_glTextureSubImage2D = (PFNGLTEXTURESUBIMAGE2DPROC)load("glTextureSubImage2D");
	glad_glTextureSubImage3D = (PFNGLTEXTURESUBIMAGE3DPROC)load("glTextureSubImage3D");
	glad_glCompressedTextureSubImage1D = (PFNGLCOMPRESSEDTEXTURESUBIMAGE1DPROC)load("glCompressedTextureSubImage1D");
	glad_glCompressedTextureSubImage2D = (PFNGLCOMPRESSEDTEXTURESUBIMAGE2DPROC)load("glCompressedTextureSubImage2D");
	glad_glCompressedTextureSubImage3D = (PFNGLCOMPRESSEDTEXTURESUBIMAGE3DPROC)load("glCompressedTextureSubImage3D");
	glad_glCopyTextureSubImage1D = (PFNGLCOPYTEXTURESUBIMAGE1DPROC)load("glCopyTextureSubImage1D");
	glad_glCopyTextureSubImage2D = (PFNGLCOPYTEXTURESUBIMAGE2DPROC)load("glCopyTextureSubImage2D");
	glad_glCopyTextureSubImage3D = (PFNGLCOPYTEXTURESUBIMAGE3DPROC)load("glCopyTextureSubImage3D");
	glad_glTextureParameterf = (PFNGLTEXTUREPARAMETERFPROC)load("glTextureParameterf");
	glad_glTextureParameterfv = (PFNGLTEXTUREPARAMETERFVPROC)load("glTextureParameterfv");
	glad_glTextureParameteri = (PFNGLTEXTUREPARAMETERIPROC)load("glTextureParameteri");
	glad_glTextureParameterIiv = (PFNGLTEXTUREPARAMETERIIVPROC)load("glTextureParameterIiv");
	glad_glTextureParameterIuiv = (PFNGLTEXTUREPARAMETERIUIVPROC)load("glTextureParameterIuiv");
	glad_glTextureParameteriv = (PFNGLTEXTUREPARAMETERIVPROC)load("glTextureParameteriv");
	glad_glGenerateTextureMipmap = (PFNGLGENERATETEXTUREMIPMAPPROC)load("glGenerateTextureMipmap");
	glad_glBindTextureUnit = (PFNGLBINDTEXTUREUNITPROC)load("glBindTextureUnit");
	glad_glGetTextureImage = (PFNGLGETTEXTUREIMAGEPROC)load("glGetTextureImage");
	glad_glGetCompressedTextureImage = (PFNGLGETCOMPRESSEDTEXTUREIMAGEPROC)load("glGetCompressedTextureImage");
	glad_glGetTextureLevelParameterfv = (PFNGLGETTEXTURELEVELPARAMETERFVPROC)load("glGetTextureLevelParameterfv");
	glad_glGetTextureLevelParameteriv = (PFNGLGETTEXTURELEVELPARAMETERIVPROC)load("glGetTextureLevelParameteriv");
	glad_glGetTextureParameterfv = (PFNGLGETTEXTUREPARAMETERFVPROC)load("glGetTextureParameterfv");
	glad_glGetTextureParameterIiv = (PFNGLGETTEXTUREPARAMETERIIVPROC)load("glGetTextureParameterIiv");
	glad_glGetTextureParameterIuiv = (PFNGLGETTEXTUREPARAMETERIUIVPROC)load("glGetTextureParameterIuiv");
	glad_glGetTextureParameteriv = (PFNGLGETTEXTUREPARAMETERIVPROC)load("glGetTextureParameteriv");
	glad_glCreateVertexArrays = (PFNGLCREATEVERTEXARRAYSPROC)load("glCreateVertexArrays");
	glad_glDisableVertexArrayAttrib = (PFNGLDISABLEVERTEXARRAYATTRIBPROC)load("glDisableVertexArrayAttrib");
	glad_glEnableVertexArrayAttrib = (PFNGLENABLEVERTEXARRAYATTRIBPROC)load("glEnableVertexArrayAttrib");
	glad_glVertexArrayElementBuffer = (PFNGLVERTEXARRAYELEMENTBUFFERPROC)load("glVertexArrayElementBuffer");
	glad_glVertexArrayVertexBuffer = (PFNGLVERTEXARRAYVERTEXBUFFERPROC)load("glVertexArrayVertexBuffer");
	glad_glVertexArrayVertexBuffers = (PFNGLVERTEXARRAYVERTEXBUFFERSPROC)load("glVertexArrayVertexBuffers");
	glad_glVertexArrayAttribBinding = (PFNGLVERTEXARRAYATTRIBBINDINGPROC)load("glVertexArrayAttribBinding");
	glad_glVertexArrayAttribFormat = (PFNGLVERTEXARRAYATTRIBFORMATPROC)load("glVertexArrayAttribFormat");
	glad_glVertexArrayAttribIFormat = (PFNGLVERTEXARRAYATTRIBIFORMATPROC)load("glVertexArrayAttribIFormat");
	glad_glVertexArrayAttribLFormat = (PFNGLVERTEXARRAYATTRIBLFORMATPROC)load("glVertexArrayAttribLFormat");
	glad_glVertexArrayBindingDivisor = (PFNGLVERTEXARRAYBINDINGDIVISORPROC)load("glVertexArrayBindingDivisor");
	glad_glGetVertexArrayiv = (PFNGLGETVERTEXARRAYIVPROC)load("glGetVertexArrayiv");
	glad_glGetVertexArrayIndexediv = (PFNGLGETVERTEXARRAYINDEXEDIVPROC)load("glGetVertexArrayIndexediv");
	glad_glGetVertexArrayIndexed64iv = (PFNGLGETVERTEXARRAYINDEXED64IVPROC)load("glGetVertexArrayIndexed64iv");
	glad_glCreateSamplers = (PFNGLCREATESAMPLERSPROC)load("glCreateSamplers");
	glad_glCreateProgramPipelines = (PFNGLCREATEPROGRAMPIPELINESPROC)load("glCreateProgramPipelines");
	glad_glCreateQueries = (PFNGLCREATEQUERIESPROC)load("glCreateQueries");
	glad_glGetQueryBufferObjecti64v = (PFNGLGETQUERYBUFFEROBJECTI64VPROC)load("glGetQueryBufferObjecti64v");
	glad_glGetQueryBufferObjectiv = (PFNGLGETQUERYBUFFEROBJECTIVPROC)load("glGetQueryBufferObjectiv");
	glad_glGetQueryBufferObjectui64v = (PFNGLGETQUERYBUFFEROBJECTUI64VPROC)load("glGetQueryBufferObjectui64v");
	glad_glGetQueryBufferObjectuiv = (PFNGLGETQUERYBUFFEROBJECTUIVPROC)load("glGetQueryBufferObjectuiv");
	glad_glMemoryBarrierByRegion = (PFNGLMEMORYBARRIERBYREGIONPROC)load("glMemoryBarrierByRegion");
	glad_glGetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)load("glGetTextureSubImage");
	glad_glGetCompressedTextureSubImage = (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)load("glGetCompressedTextureSubImage");
	glad_glGetGraphicsResetStatus = (PFNGLGETGRAPHICSRESETSTATUSPROC)load("glGetGraphicsResetStatus");
	glad_glGetnCompressedTexImage = (PFNGLGETNCOMPRESSEDTEXIMAGEPROC)load("glGetnCompressedTexImage");
	glad_glGetnTexImage = (PFNGLGETNTEXIMAGEPROC)load("glGetnTexImage");
	glad_glGetnUniformdv = (PFNGLGETNUNIFORMDVPROC)load("glGetnUniformdv");
	glad_glGetnUniformfv = (PFNGLGETNUNIFORMFVPROC)load("glGetnUniformfv");
	glad_glGetnUniformiv = (PFNGLGETNUNIFORMIVPROC)load("glGetnUniformiv");
	glad_glGetnUniformuiv = (PFNGLGETNUNIFORMUIVPROC)load("glGetnUniformuiv");
	glad_glReadnPixels = (PFNGLREADNPIXELSPROC)load("glReadnPixels");
	glad_glGetnMapdv = (PFNGLGETNMAPDVPROC)load("glGetnMapdv");
	glad_glGetnMapfv = (PFNGLGETNMAPFVPROC)load("glGetnMapfv");
	glad_glGetnMapiv = (PFNGLGETNMAPIVPROC)load("glGetnMapiv");
	glad_glGetnPixelMapfv = (PFNGLGETNPIXELMAPFVPROC)load("glGetnPixelMapfv");
	glad_glGetnPixelMapuiv = (PFNGLGETNPIXELMAPUIVPROC)load("glGetnPixelMapuiv");
	glad_glGetnPixelMapusv = (PFNGLGETNPIXELMAPUSVPROC)load("glGetnPixelMapusv");
	glad_glGetnPolygonStipple = (PFNGLGETNPOLYGONSTIPPLEPROC)load("glGetnPolygonStipple");
	glad_glGetnColorTable = (PFNGLGETNCOLORTABLEPROC)load("glGetnColorTable");
	glad_glGetnConvolutionFilter = (PFNGLGETNCONVOLUTIONFILTERPROC)load("glGetnConvolutionFilter");
	glad_glGetnSeparableFilter = (PFNGLGETNSEPARABLEFILTERPROC)load("glGetnSeparableFilter");
	glad_glGetnHistogram = (PFNGLGETNHISTOGRAMPROC)load("glGetnHistogram");
	glad_glGetnMinmax = (PFNGLGETNMINMAXPROC)load("glGetnMinmax");
	glad_glTextureBarrier = (PFNGLTEXTUREBARRIERPROC)load("glTextureBarrier");
}